

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  bool bVar1;
  
  if (c == '[') {
    bVar1 = std::operator==(&this->m_substring,"exclude:");
    if (bVar1) {
      this->m_exclusion = true;
    }
    else {
      endMode(this);
    }
    this->m_mode = Tag;
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar(char c) {
        if (c == '[') {
            if (m_substring == "exclude:")
                m_exclusion = true;
            else
                endMode();
            startNewMode(Tag);
        }
    }